

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O1

void InitScope(Scope *scope)

{
  scope->paramsLength = 0;
  scope->paramsSpot = 0;
  scope->paramItemsLength = 0;
  scope->paramItemsSpot = 0;
  scope->nodeSpot = 0;
  scope->nodeLength = 0;
  scope->scopeLength = 0;
  scope->scopeSpot = 0;
  return;
}

Assistant:

void InitScope(Scope* scope){
	scope->nodeSpot = 0;
	scope->scopeLength = 0;
	scope->nodeLength = 0;
	scope->scopeSpot = 0;
	scope->paramsLength = 0;
	scope->paramsSpot = 0;
	scope->paramItemsLength = 0;
	scope->paramItemsSpot = 0;
}